

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regex.c
# Opt level: O0

void re_concat_onto(re_context *ctx,re_machine *dest,re_machine *rhs)

{
  int iVar1;
  re_machine *in_RDX;
  re_context *in_RSI;
  re_context *in_RDI;
  re_machine new_machine;
  re_machine *in_stack_ffffffffffffffd8;
  errcxdef *in_stack_ffffffffffffffe0;
  
  iVar1 = re_is_machine_null(in_RDI,(re_machine *)in_RSI);
  if (iVar1 == 0) {
    re_build_concat(in_RSI,in_RDX,(re_machine *)in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8)
    ;
    in_RSI->errctx = in_stack_ffffffffffffffe0;
  }
  else {
    in_RSI->errctx = (errcxdef *)*in_RDX;
  }
  return;
}

Assistant:

static void re_concat_onto(re_context *ctx,
                           re_machine *dest, re_machine *rhs)
{
    /* check for a null destination machine */
    if (re_is_machine_null(ctx, dest))
    {
        /* 
         *   the first machine is null - simply copy the second machine
         *   onto the first unchanged 
         */
        *dest = *rhs;
    }
    else
    {
        re_machine new_machine;
        
        /* build the concatenated machine */
        re_build_concat(ctx, &new_machine, dest, rhs);

        /* copy the concatenated machine onto the first machine */
        *dest = new_machine;
    }
}